

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O1

void __thiscall APathFollower::Serialize(APathFollower *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  AActor::Serialize(&this->super_AActor,arc);
  pFVar1 = ::Serialize(arc,"active",(bool *)&(this->super_AActor).field_0x4bc,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"juststepped",(bool *)&(this->super_AActor).field_0x4bd,(bool *)0x0);
  ::Serialize(pFVar1,"prevnode",(DObject **)&this->PrevNode,(DObject **)0x0,(bool *)0x0);
  ::Serialize(pFVar1,"currnode",(DObject **)&this->CurrNode,(DObject **)0x0,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"time",&this->Time,(float *)0x0);
  ::Serialize(pFVar1,"holdtime",&this->HoldTime,(int32_t *)0x0);
  return;
}

Assistant:

void APathFollower::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("active", bActive)
		("juststepped", bJustStepped)
		("prevnode", PrevNode)
		("currnode", CurrNode)
		("time", Time)
		("holdtime", HoldTime);
}